

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O0

void celero::executor::Run(shared_ptr<celero::Benchmark> *bmark)

{
  bool bVar1;
  shared_ptr<celero::Benchmark> local_40 [2];
  shared_ptr<celero::Benchmark> local_20;
  shared_ptr<celero::Benchmark> *local_10;
  shared_ptr<celero::Benchmark> *bmark_local;
  
  local_10 = bmark;
  std::shared_ptr<celero::Benchmark>::shared_ptr(&local_20,bmark);
  bVar1 = RunBaseline(&local_20);
  std::shared_ptr<celero::Benchmark>::~shared_ptr(&local_20);
  if (bVar1) {
    std::shared_ptr<celero::Benchmark>::shared_ptr(local_40,bmark);
    RunExperiments(local_40);
    std::shared_ptr<celero::Benchmark>::~shared_ptr(local_40);
  }
  return;
}

Assistant:

void executor::Run(std::shared_ptr<Benchmark> bmark)
{
	if(executor::RunBaseline(bmark) == true)
	{
		executor::RunExperiments(bmark);
	}
}